

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters_sse2.c
# Opt level: O0

void HorizontalUnfilter_SSE2(uint8_t *prev,uint8_t *in,uint8_t *out,int width)

{
  undefined8 uVar1;
  int in_ECX;
  char *in_RDX;
  char *in_RSI;
  char *in_RDI;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  __m128i A0;
  __m128i last;
  int i;
  int local_118;
  __m128i A7;
  __m128i A6;
  __m128i A5;
  __m128i A4;
  __m128i A3;
  __m128i A2;
  __m128i A1;
  
  if (in_RDI == (char *)0x0) {
    cVar6 = '\0';
  }
  else {
    cVar6 = *in_RDI;
  }
  *in_RDX = *in_RSI + cVar6;
  if (1 < in_ECX) {
    cVar6 = *in_RDX;
    for (local_118 = 1; local_118 + 8 <= in_ECX; local_118 = local_118 + 8) {
      uVar1 = *(undefined8 *)(in_RSI + local_118);
      A5[1]._0_1_ = (char)uVar1;
      A5[1]._1_1_ = (char)((ulong)uVar1 >> 8);
      A5[1]._2_1_ = (char)((ulong)uVar1 >> 0x10);
      A5[1]._3_1_ = (char)((ulong)uVar1 >> 0x18);
      A5[1]._4_1_ = (char)((ulong)uVar1 >> 0x20);
      A5[1]._5_1_ = (char)((ulong)uVar1 >> 0x28);
      A5[1]._6_1_ = (char)((ulong)uVar1 >> 0x30);
      A5[1]._7_1_ = (char)((ulong)uVar1 >> 0x38);
      cVar2 = (char)A5[1] + cVar6;
      cVar3 = A5[1]._1_1_ + cVar2;
      cVar4 = A5[1]._2_1_ + A5[1]._1_1_ + cVar2;
      cVar5 = A5[1]._3_1_ + A5[1]._2_1_ + cVar3;
      cVar6 = A5[1]._7_1_ + A5[1]._6_1_ + A5[1]._5_1_ + A5[1]._4_1_ + cVar5;
      *(ulong *)(in_RDX + local_118) =
           CONCAT17(cVar6,CONCAT16(A5[1]._6_1_ + A5[1]._5_1_ + A5[1]._4_1_ + A5[1]._3_1_ + cVar4,
                                   CONCAT15(A5[1]._5_1_ + A5[1]._4_1_ + A5[1]._3_1_ + A5[1]._2_1_ +
                                            cVar3,CONCAT14(A5[1]._4_1_ + A5[1]._3_1_ +
                                                           A5[1]._2_1_ + A5[1]._1_1_ + cVar2,
                                                           CONCAT13(cVar5,CONCAT12(cVar4,CONCAT11(
                                                  cVar3,cVar2)))))));
    }
    for (; local_118 < in_ECX; local_118 = local_118 + 1) {
      in_RDX[local_118] = in_RSI[local_118] + in_RDX[local_118 + -1];
    }
  }
  return;
}

Assistant:

static void HorizontalUnfilter_SSE2(const uint8_t* prev, const uint8_t* in,
                                    uint8_t* out, int width) {
  int i;
  __m128i last;
  out[0] = (uint8_t)(in[0] + (prev == NULL ? 0 : prev[0]));
  if (width <= 1) return;
  last = _mm_set_epi32(0, 0, 0, out[0]);
  for (i = 1; i + 8 <= width; i += 8) {
    const __m128i A0 = _mm_loadl_epi64((const __m128i*)(in + i));
    const __m128i A1 = _mm_add_epi8(A0, last);
    const __m128i A2 = _mm_slli_si128(A1, 1);
    const __m128i A3 = _mm_add_epi8(A1, A2);
    const __m128i A4 = _mm_slli_si128(A3, 2);
    const __m128i A5 = _mm_add_epi8(A3, A4);
    const __m128i A6 = _mm_slli_si128(A5, 4);
    const __m128i A7 = _mm_add_epi8(A5, A6);
    _mm_storel_epi64((__m128i*)(out + i), A7);
    last = _mm_srli_epi64(A7, 56);
  }
  for (; i < width; ++i) out[i] = (uint8_t)(in[i] + out[i - 1]);
}